

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O1

int32_t llama_chat_apply_template
                  (char *tmpl,llama_chat_message *chat,size_t n_msg,bool add_ass,char *buf,
                  int32_t length)

{
  llm_chat_template tmpl_00;
  int32_t iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> chat_vec;
  string curr_tmpl;
  string formatted_chat;
  vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_> local_88;
  string local_70;
  string local_50;
  
  __s = "chatml";
  if (tmpl != (char *)0x0) {
    __s = tmpl;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar2);
  local_88.
  super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>::resize
            (&local_88,n_msg);
  if (n_msg != 0) {
    sVar3 = 0;
    do {
      local_88.
      super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
      _M_impl.super__Vector_impl_data._M_start[sVar3] = chat;
      sVar3 = sVar3 + 1;
      chat = chat + 1;
    } while (n_msg != sVar3);
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  tmpl_00 = llm_chat_detect_template(&local_70);
  iVar1 = -1;
  if (tmpl_00 != LLM_CHAT_TEMPLATE_UNKNOWN) {
    iVar1 = llm_chat_apply_template(tmpl_00,&local_88,&local_50,add_ass);
    if ((-1 < iVar1) && (0 < length && buf != (char *)0x0)) {
      strncpy(buf,local_50._M_dataplus._M_p,(ulong)(uint)length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (local_88.
      super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<const_llama_chat_message_*,_std::allocator<const_llama_chat_message_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int32_t llama_chat_apply_template(
                              const char * tmpl,
         const struct llama_chat_message * chat,
                                  size_t   n_msg,
                                    bool   add_ass,
                                    char * buf,
                                 int32_t   length) {
    const std::string curr_tmpl(tmpl == nullptr ? "chatml" : tmpl);

    // format the chat to string
    std::vector<const llama_chat_message *> chat_vec;
    chat_vec.resize(n_msg);
    for (size_t i = 0; i < n_msg; i++) {
        chat_vec[i] = &chat[i];
    }

    std::string formatted_chat;
    llm_chat_template detected_tmpl = llm_chat_detect_template(curr_tmpl);
    if (detected_tmpl == LLM_CHAT_TEMPLATE_UNKNOWN) {
        return -1;
    }
    int32_t res = llm_chat_apply_template(detected_tmpl, chat_vec, formatted_chat, add_ass);
    if (res < 0) {
        return res;
    }
    if (buf && length > 0) {
        strncpy(buf, formatted_chat.c_str(), length);
    }
    return res;
}